

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH128_hash_t VELOCYPACK_XXH3_128bits_digest(XXH3_state_t *state)

{
  void *secret_00;
  XXH64_hash_t XVar1;
  XXH64_hash_t XVar2;
  long in_RDI;
  XXH128_hash_t XVar3;
  XXH64_hash_t *unaff_retaddr;
  XXH64_hash_t acc [8];
  uchar *secret;
  XXH128_hash_t h128;
  size_t in_stack_ffffffffffffff88;
  xxh_u8 *in_stack_ffffffffffffff98;
  xxh_u64 *in_stack_ffffffffffffffa0;
  undefined1 in_stack_fffffffffffffff0 [16];
  
  if (*(long *)(in_RDI + 0x238) == 0) {
    secret_00 = (void *)(in_RDI + 0x40);
  }
  else {
    secret_00 = *(void **)(in_RDI + 0x238);
  }
  if (*(ulong *)(in_RDI + 0x210) < 0xf1) {
    if (*(long *)(in_RDI + 0x228) == 0) {
      XVar3 = VELOCYPACK_XXH3_128bits_withSecret
                        (in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,secret_00,
                         in_stack_ffffffffffffff88);
    }
    else {
      XVar3 = VELOCYPACK_XXH3_128bits_withSeed(secret_00,in_stack_ffffffffffffff88,0x12ac10);
    }
  }
  else {
    XXH3_digest_long(unaff_retaddr,in_stack_fffffffffffffff0._8_8_,in_stack_fffffffffffffff0._0_8_);
    XVar1 = XXH3_mergeAccs(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(xxh_u64)secret_00);
    XVar2 = XXH3_mergeAccs(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(xxh_u64)secret_00);
    XVar3.high64 = XVar2;
    XVar3.low64 = XVar1;
  }
  return XVar3;
}

Assistant:

XXH_PUBLIC_API XXH128_hash_t XXH3_128bits_digest(const XXH3_state_t* state) {
  const unsigned char* const secret =
      (state->extSecret == NULL) ? state->customSecret : state->extSecret;
  if (state->totalLen > XXH3_MIDSIZE_MAX) {
    XXH_ALIGN(XXH_ACC_ALIGN) XXH64_hash_t acc[XXH_ACC_NB];
    XXH3_digest_long(acc, state, secret);
    XXH_ASSERT(state->secretLimit + XXH_STRIPE_LEN >=
               sizeof(acc) + XXH_SECRET_MERGEACCS_START);
    {
      XXH128_hash_t h128;
      h128.low64 = XXH3_mergeAccs(acc, secret + XXH_SECRET_MERGEACCS_START,
                                  (xxh_u64)state->totalLen * XXH_PRIME64_1);
      h128.high64 =
          XXH3_mergeAccs(acc,
                         secret + state->secretLimit + XXH_STRIPE_LEN -
                             sizeof(acc) - XXH_SECRET_MERGEACCS_START,
                         ~((xxh_u64)state->totalLen * XXH_PRIME64_2));
      return h128;
    }
  }
  /* len <= XXH3_MIDSIZE_MAX : short code */
  if (state->seed)
    return XXH3_128bits_withSeed(state->buffer, (size_t)state->totalLen,
                                 state->seed);
  return XXH3_128bits_withSecret(state->buffer, (size_t)(state->totalLen),
                                 secret, state->secretLimit + XXH_STRIPE_LEN);
}